

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void sys_doflags(void)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int local_1c;
  int rcode;
  int len;
  char **rcargv;
  int rcargc;
  
  rcargv._4_4_ = 0;
  _rcode = (char **)0x0;
  if (sys_flags == (t_symbol *)0x0) {
    sys_flags = &s_;
  }
  sVar3 = strlen(sys_flags->s_name);
  if ((int)sVar3 < 0x3e9) {
    uVar1 = string2args(sys_flags->s_name,(int *)((long)&rcargv + 4),(char ***)&rcode);
    if ((int)uVar1 < 0) {
      pd_error((void *)0x0,"error#%d while parsing flags",(ulong)uVar1);
    }
    else {
      iVar2 = sys_argparse(rcargv._4_4_,_rcode);
      if (iVar2 != 0) {
        pd_error((void *)0x0,"error parsing startup arguments");
      }
      for (local_1c = 0; local_1c < rcargv._4_4_; local_1c = local_1c + 1) {
        free(_rcode[local_1c]);
      }
      free(_rcode);
    }
  }
  else {
    pd_error((void *)0x0,"flags: %s: too long",sys_flags->s_name);
  }
  return;
}

Assistant:

void sys_doflags(void)
{
    int rcargc=0;
    const char**rcargv = NULL;
    int len;
    int rcode = 0;
    if (!sys_flags)
        sys_flags = &s_;
    len = (int)strlen(sys_flags->s_name);
    if (len > MAXPDSTRING)
    {
        pd_error(0, "flags: %s: too long", sys_flags->s_name);
        return;
    }
    rcode = string2args(sys_flags->s_name, &rcargc, &rcargv);
    if(rcode < 0) {
        pd_error(0, "error#%d while parsing flags", rcode);
        return;
    }

    if (sys_argparse(rcargc, rcargv))
        pd_error(0, "error parsing startup arguments");

    for(len=0; len<rcargc; len++)
        free((void*)rcargv[len]);
    free(rcargv);
}